

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

void __thiscall
leveldb::CorruptionTest::Check(CorruptionTest *this,int min_expected,int max_expected)

{
  uint uVar1;
  size_t sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  uint uVar8;
  char *message;
  Slice SVar9;
  undefined1 auVar10 [16];
  int correct;
  uint64_t key;
  Slice in;
  int max_expected_local;
  ulong local_70;
  ulong local_68;
  AssertHelper local_60;
  int min_expected_local;
  string value_space;
  long *plVar7;
  
  correct = 0;
  value_space._M_dataplus._M_p = (pointer)&value_space.field_2;
  value_space._M_string_length = 0;
  value_space.field_2._M_local_buf[0] = '\0';
  in.data_ = (char *)0x100;
  in.size_ = 0;
  max_expected_local = max_expected;
  min_expected_local = min_expected;
  iVar5 = (*this->db_->_vptr_DB[6])();
  plVar7 = (long *)CONCAT44(extraout_var,iVar5);
  (**(code **)(*plVar7 + 0x18))(plVar7);
  cVar3 = (**(code **)(*plVar7 + 0x10))(plVar7);
  local_68 = 0;
  uVar8 = 0;
  local_70 = 0;
  if (cVar3 != '\0') {
    iVar5 = 0;
    local_70 = 0;
    uVar8 = 0;
    local_68 = 0;
    do {
      SVar9 = (Slice)(**(code **)(*plVar7 + 0x40))(plVar7);
      in = SVar9;
      if (SVar9.size_ == 1) {
        iVar6 = bcmp(SVar9.data_,"~",1);
        if (iVar6 != 0) goto LAB_0010ade7;
      }
      else {
        if (SVar9.size_ == 0) {
          iVar6 = bcmp(SVar9.data_,"",0);
          if (iVar6 == 0) goto LAB_0010ae90;
        }
LAB_0010ade7:
        bVar4 = ConsumeDecimalNumber(&in,&key);
        uVar1 = (uint)key;
        if (((bVar4) && (in.size_ == 0)) && ((ulong)(long)iVar5 <= CONCAT44(key._4_4_,(uint)key))) {
          auVar10 = (**(code **)(*plVar7 + 0x48))(plVar7);
          local_60.data_._0_4_ = (uint)key & 0x7fffffff;
          if (((uint)local_60.data_ == 0x7fffffff) || ((uint)local_60.data_ == 0)) {
            local_60.data_._0_4_ = 1;
          }
          local_68 = (ulong)((int)local_68 + (uVar1 - iVar5));
          iVar5 = uVar1 + 1;
          SVar9 = test::RandomString((Random *)&local_60,1000,&value_space);
          if (auVar10._8_8_ == SVar9.size_) {
            iVar6 = bcmp(auVar10._0_8_,SVar9.data_,auVar10._8_8_);
            if (iVar6 == 0) {
              correct = correct + 1;
              goto LAB_0010ae90;
            }
          }
          local_70 = (ulong)((int)local_70 + 1);
        }
        else {
          uVar8 = uVar8 + 1;
        }
      }
LAB_0010ae90:
      (**(code **)(*plVar7 + 0x30))(plVar7);
      cVar3 = (**(code **)(*plVar7 + 0x10))(plVar7);
    } while (cVar3 != '\0');
  }
  (**(code **)(*plVar7 + 8))(plVar7);
  fprintf(_stderr,"expected=%d..%d; got=%d; bad_keys=%d; bad_values=%d; missed=%d\n",
          (ulong)(uint)min_expected_local,(ulong)(uint)max_expected_local,(ulong)(uint)correct,
          (ulong)uVar8,local_70,local_68);
  testing::internal::CmpHelperLE<int,int>
            ((internal *)&in,"min_expected","correct",&min_expected_local,&correct);
  sVar2 = in.size_;
  if ((char)in.data_ == '\0') {
    testing::Message::Message((Message *)&key);
    if (in.size_ == 0) {
      message = "";
    }
    else {
      message = *(char **)in.size_;
    }
    iVar5 = 0x6d;
  }
  else {
    if (in.size_ != 0) {
      if (*(void **)in.size_ != (void *)(in.size_ + 0x10)) {
        operator_delete(*(void **)in.size_);
      }
      operator_delete((void *)sVar2);
    }
    testing::internal::CmpHelperGE<int,int>
              ((internal *)&in,"max_expected","correct",&max_expected_local,&correct);
    if ((char)in.data_ != '\0') goto LAB_0010affe;
    testing::Message::Message((Message *)&key);
    if (in.size_ == 0) {
      message = "";
    }
    else {
      message = *(char **)in.size_;
    }
    iVar5 = 0x6e;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/corruption_test.cc"
             ,iVar5,message);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&key);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((long *)CONCAT44(key._4_4_,(uint)key) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(key._4_4_,(uint)key) + 8))();
  }
LAB_0010affe:
  sVar2 = in.size_;
  if (in.size_ != 0) {
    if (*(void **)in.size_ != (void *)(in.size_ + 0x10)) {
      operator_delete(*(void **)in.size_);
    }
    operator_delete((void *)sVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value_space._M_dataplus._M_p != &value_space.field_2) {
    operator_delete(value_space._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Check(int min_expected, int max_expected) {
    int next_expected = 0;
    int missed = 0;
    int bad_keys = 0;
    int bad_values = 0;
    int correct = 0;
    std::string value_space;
    Iterator* iter = db_->NewIterator(ReadOptions());
    for (iter->SeekToFirst(); iter->Valid(); iter->Next()) {
      uint64_t key;
      Slice in(iter->key());
      if (in == "" || in == "~") {
        // Ignore boundary keys.
        continue;
      }
      if (!ConsumeDecimalNumber(&in, &key) || !in.empty() ||
          key < next_expected) {
        bad_keys++;
        continue;
      }
      missed += (key - next_expected);
      next_expected = key + 1;
      if (iter->value() != Value(key, &value_space)) {
        bad_values++;
      } else {
        correct++;
      }
    }
    delete iter;

    std::fprintf(
        stderr,
        "expected=%d..%d; got=%d; bad_keys=%d; bad_values=%d; missed=%d\n",
        min_expected, max_expected, correct, bad_keys, bad_values, missed);
    ASSERT_LE(min_expected, correct);
    ASSERT_GE(max_expected, correct);
  }